

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Polynomial.cpp
# Opt level: O1

string * __thiscall
Polynomial::evaluateSymbolic
          (string *__return_storage_ptr__,Polynomial *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *varnames)

{
  pointer pcVar1;
  pointer poVar2;
  bool bVar3;
  string *psVar4;
  uint uVar5;
  int iVar6;
  uint uVar7;
  undefined8 *puVar8;
  long *plVar9;
  ulong uVar10;
  ulong *puVar11;
  size_type *psVar12;
  uint uVar13;
  uint uVar14;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar15;
  undefined8 uVar16;
  _Alloc_hider _Var17;
  long lVar18;
  uint uVar19;
  long lVar20;
  int iVar21;
  string __str;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  strs;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d8;
  ulong *local_b8;
  long local_b0;
  ulong local_a8;
  long lStack_a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_98;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_78;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_60;
  long local_58;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_50;
  Polynomial *local_40;
  string *local_38;
  
  local_78.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_78.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_78.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_40 = this;
  local_38 = __return_storage_ptr__;
  if (0 < this->mNumStates) {
    uVar13 = 0;
    do {
      uVar19 = 1;
      if (9 < uVar13) {
        uVar10 = (ulong)uVar13;
        uVar14 = 4;
        do {
          uVar19 = uVar14;
          uVar5 = (uint)uVar10;
          if (uVar5 < 100) {
            uVar19 = uVar19 - 2;
            goto LAB_00107794;
          }
          if (uVar5 < 1000) {
            uVar19 = uVar19 - 1;
            goto LAB_00107794;
          }
          if (uVar5 < 10000) goto LAB_00107794;
          uVar10 = uVar10 / 10000;
          uVar14 = uVar19 + 4;
        } while (99999 < uVar5);
        uVar19 = uVar19 + 1;
      }
LAB_00107794:
      local_d8._M_dataplus._M_p = (pointer)&local_d8.field_2;
      std::__cxx11::string::_M_construct((ulong)&local_d8,(char)uVar19);
      std::__detail::__to_chars_10_impl<unsigned_int>(local_d8._M_dataplus._M_p,uVar19,uVar13);
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      emplace_back<std::__cxx11::string>
                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&local_78,
                 &local_d8);
      this = local_40;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_d8._M_dataplus._M_p != &local_d8.field_2) {
        operator_delete(local_d8._M_dataplus._M_p,local_d8.field_2._M_allocated_capacity + 1);
      }
      uVar13 = uVar13 + 1;
    } while ((int)uVar13 < this->mNumStates);
  }
  if (0 < this->mNumVariables) {
    lVar20 = 0;
    lVar18 = 0;
    do {
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back(&local_78,
                  (value_type *)
                  ((long)&(((varnames->
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            )._M_impl.super__Vector_impl_data._M_start)->_M_dataplus)._M_p + lVar20)
                 );
      lVar18 = lVar18 + 1;
      lVar20 = lVar20 + 0x20;
    } while (lVar18 < this->mNumVariables);
  }
  iVar21 = this->mFirstOperation;
  iVar6 = this->mResultLocation;
  if (iVar21 <= iVar6) {
    do {
      paVar15 = &local_d8.field_2;
      lVar18 = (long)iVar21 - (long)this->mFirstOperation;
      poVar2 = (this->mOperands).
               super__Vector_base<Polynomial::operand,_std::allocator<Polynomial::operand>_>._M_impl
               .super__Vector_impl_data._M_start;
      switch(poVar2[lVar18].op) {
      case PLUS:
        std::operator+(&local_98,"(",
                       local_78.
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start +
                       *poVar2[lVar18].args.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_start);
        plVar9 = (long *)std::__cxx11::string::append((char *)&local_98);
        puVar11 = (ulong *)(plVar9 + 2);
        if ((ulong *)*plVar9 == puVar11) {
          local_a8 = *puVar11;
          lStack_a0 = plVar9[3];
          local_b8 = &local_a8;
        }
        else {
          local_a8 = *puVar11;
          local_b8 = (ulong *)*plVar9;
        }
        local_b0 = plVar9[1];
        *plVar9 = (long)puVar11;
        plVar9[1] = 0;
        *(undefined1 *)(plVar9 + 2) = 0;
        puVar8 = (undefined8 *)
                 std::__cxx11::string::_M_append
                           ((char *)&local_b8,
                            (ulong)local_78.
                                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                   ._M_impl.super__Vector_impl_data._M_start
                                   [*(int *)(*(long *)&poVar2[lVar18].args.
                                                       super__Vector_base<int,_std::allocator<int>_>
                                                       ._M_impl.super__Vector_impl_data + 4)].
                                   _M_dataplus._M_p);
        local_f8._M_dataplus._M_p = (pointer)&local_f8.field_2;
        puVar11 = puVar8 + 2;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*puVar8 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)puVar11) {
          local_f8.field_2._M_allocated_capacity = *puVar11;
          local_f8.field_2._8_8_ = puVar8[3];
        }
        else {
          local_f8.field_2._M_allocated_capacity = *puVar11;
          local_f8._M_dataplus._M_p = (pointer)*puVar8;
        }
        local_f8._M_string_length = puVar8[1];
        *puVar8 = puVar11;
        puVar8[1] = 0;
        *(undefined1 *)(puVar8 + 2) = 0;
        plVar9 = (long *)std::__cxx11::string::append((char *)&local_f8);
        psVar12 = (size_type *)(plVar9 + 2);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*plVar9 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)psVar12) {
          local_d8.field_2._M_allocated_capacity = *psVar12;
          local_d8.field_2._8_8_ = plVar9[3];
          local_d8._M_dataplus._M_p = (pointer)paVar15;
        }
        else {
          local_d8.field_2._M_allocated_capacity = *psVar12;
          local_d8._M_dataplus._M_p = (pointer)*plVar9;
        }
        local_d8._M_string_length = plVar9[1];
        *plVar9 = (long)psVar12;
        plVar9[1] = 0;
        *(undefined1 *)(plVar9 + 2) = 0;
        std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
        emplace_back<std::__cxx11::string>
                  ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&local_78,
                   &local_d8);
        break;
      case TIMES:
        std::operator+(&local_98,"(",
                       local_78.
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start +
                       *poVar2[lVar18].args.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_start);
        puVar8 = (undefined8 *)std::__cxx11::string::append((char *)&local_98);
        puVar11 = puVar8 + 2;
        if ((ulong *)*puVar8 == puVar11) {
          local_a8 = *puVar11;
          lStack_a0 = puVar8[3];
          local_b8 = &local_a8;
        }
        else {
          local_a8 = *puVar11;
          local_b8 = (ulong *)*puVar8;
        }
        local_b0 = puVar8[1];
        *puVar8 = puVar11;
        puVar8[1] = 0;
        *(undefined1 *)(puVar8 + 2) = 0;
        puVar8 = (undefined8 *)
                 std::__cxx11::string::_M_append
                           ((char *)&local_b8,
                            (ulong)local_78.
                                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                   ._M_impl.super__Vector_impl_data._M_start
                                   [*(int *)(*(long *)&poVar2[lVar18].args.
                                                       super__Vector_base<int,_std::allocator<int>_>
                                                       ._M_impl.super__Vector_impl_data + 4)].
                                   _M_dataplus._M_p);
        local_f8._M_dataplus._M_p = (pointer)&local_f8.field_2;
        puVar11 = puVar8 + 2;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*puVar8 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)puVar11) {
          local_f8.field_2._M_allocated_capacity = *puVar11;
          local_f8.field_2._8_8_ = puVar8[3];
        }
        else {
          local_f8.field_2._M_allocated_capacity = *puVar11;
          local_f8._M_dataplus._M_p = (pointer)*puVar8;
        }
        local_f8._M_string_length = puVar8[1];
        *puVar8 = puVar11;
        puVar8[1] = 0;
        *(undefined1 *)(puVar8 + 2) = 0;
        plVar9 = (long *)std::__cxx11::string::append((char *)&local_f8);
        psVar12 = (size_type *)(plVar9 + 2);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*plVar9 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)psVar12) {
          local_d8.field_2._M_allocated_capacity = *psVar12;
          local_d8.field_2._8_8_ = plVar9[3];
          local_d8._M_dataplus._M_p = (pointer)paVar15;
        }
        else {
          local_d8.field_2._M_allocated_capacity = *psVar12;
          local_d8._M_dataplus._M_p = (pointer)*plVar9;
        }
        local_d8._M_string_length = plVar9[1];
        *plVar9 = (long)psVar12;
        plVar9[1] = 0;
        *(undefined1 *)(plVar9 + 2) = 0;
        std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
        emplace_back<std::__cxx11::string>
                  ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&local_78,
                   &local_d8);
        break;
      case POWER:
        std::operator+(&local_98,"(",
                       local_78.
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start +
                       *poVar2[lVar18].args.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_start);
        puVar8 = (undefined8 *)std::__cxx11::string::append((char *)&local_98);
        puVar11 = puVar8 + 2;
        if ((ulong *)*puVar8 == puVar11) {
          local_a8 = *puVar11;
          lStack_a0 = puVar8[3];
          local_b8 = &local_a8;
        }
        else {
          local_a8 = *puVar11;
          local_b8 = (ulong *)*puVar8;
        }
        local_b0 = puVar8[1];
        *puVar8 = puVar11;
        puVar8[1] = 0;
        *(undefined1 *)(puVar8 + 2) = 0;
        uVar13 = *(uint *)(*(long *)&poVar2[lVar18].args.
                                     super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                     super__Vector_impl_data + 4);
        uVar19 = -uVar13;
        if (0 < (int)uVar13) {
          uVar19 = uVar13;
        }
        uVar14 = 1;
        if (9 < uVar19) {
          uVar10 = (ulong)uVar19;
          uVar5 = 4;
          do {
            uVar14 = uVar5;
            uVar7 = (uint)uVar10;
            if (uVar7 < 100) {
              uVar14 = uVar14 - 2;
              goto LAB_00108079;
            }
            if (uVar7 < 1000) {
              uVar14 = uVar14 - 1;
              goto LAB_00108079;
            }
            if (uVar7 < 10000) goto LAB_00108079;
            uVar10 = uVar10 / 10000;
            uVar5 = uVar14 + 4;
          } while (99999 < uVar7);
          uVar14 = uVar14 + 1;
        }
LAB_00108079:
        local_60 = &local_50;
        std::__cxx11::string::_M_construct
                  ((ulong)&local_60,(char)uVar14 - (char)((int)uVar13 >> 0x1f));
        std::__detail::__to_chars_10_impl<unsigned_int>
                  (local_60->_M_local_buf + (uVar13 >> 0x1f),uVar14,uVar19);
        uVar10 = 0xf;
        if (local_b8 != &local_a8) {
          uVar10 = local_a8;
        }
        if (uVar10 < (ulong)(local_58 + local_b0)) {
          uVar16 = 0xf;
          if (local_60 != &local_50) {
            uVar16 = local_50._M_allocated_capacity;
          }
          if ((ulong)uVar16 < (ulong)(local_58 + local_b0)) goto LAB_00108113;
          puVar8 = (undefined8 *)
                   std::__cxx11::string::replace((ulong)&local_60,0,(char *)0x0,(ulong)local_b8);
        }
        else {
LAB_00108113:
          puVar8 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_b8,(ulong)local_60);
        }
        local_f8._M_dataplus._M_p = (pointer)&local_f8.field_2;
        puVar11 = puVar8 + 2;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*puVar8 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)puVar11) {
          local_f8.field_2._M_allocated_capacity = *puVar11;
          local_f8.field_2._8_8_ = puVar8[3];
        }
        else {
          local_f8.field_2._M_allocated_capacity = *puVar11;
          local_f8._M_dataplus._M_p = (pointer)*puVar8;
        }
        local_f8._M_string_length = puVar8[1];
        *puVar8 = puVar11;
        puVar8[1] = 0;
        *(undefined1 *)puVar11 = 0;
        plVar9 = (long *)std::__cxx11::string::append((char *)&local_f8);
        psVar12 = (size_type *)(plVar9 + 2);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*plVar9 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)psVar12) {
          local_d8.field_2._M_allocated_capacity = *psVar12;
          local_d8.field_2._8_8_ = plVar9[3];
          local_d8._M_dataplus._M_p = (pointer)&local_d8.field_2;
        }
        else {
          local_d8.field_2._M_allocated_capacity = *psVar12;
          local_d8._M_dataplus._M_p = (pointer)*plVar9;
        }
        local_d8._M_string_length = plVar9[1];
        *plVar9 = (long)psVar12;
        plVar9[1] = 0;
        *(undefined1 *)(plVar9 + 2) = 0;
        std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
        emplace_back<std::__cxx11::string>
                  ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&local_78,
                   &local_d8);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_d8._M_dataplus._M_p != &local_d8.field_2) {
          operator_delete(local_d8._M_dataplus._M_p,local_d8.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_f8._M_dataplus._M_p != &local_f8.field_2) {
          operator_delete(local_f8._M_dataplus._M_p,local_f8.field_2._M_allocated_capacity + 1);
        }
        uVar16 = local_50._M_allocated_capacity;
        _Var17._M_p = (pointer)local_60;
        if (local_60 != &local_50) goto LAB_00108017;
        goto LAB_0010801f;
      case NOT:
        std::operator+(&local_f8,"(~",
                       local_78.
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start +
                       *poVar2[lVar18].args.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_start);
        plVar9 = (long *)std::__cxx11::string::append((char *)&local_f8);
        psVar12 = (size_type *)(plVar9 + 2);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*plVar9 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)psVar12) {
          local_d8.field_2._M_allocated_capacity = *psVar12;
          local_d8.field_2._8_8_ = plVar9[3];
          local_d8._M_dataplus._M_p = (pointer)paVar15;
        }
        else {
          local_d8.field_2._M_allocated_capacity = *psVar12;
          local_d8._M_dataplus._M_p = (pointer)*plVar9;
        }
        local_d8._M_string_length = plVar9[1];
        *plVar9 = (long)psVar12;
        plVar9[1] = 0;
        *(undefined1 *)(plVar9 + 2) = 0;
        std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
        emplace_back<std::__cxx11::string>
                  ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&local_78,
                   &local_d8);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_d8._M_dataplus._M_p != paVar15) {
          operator_delete(local_d8._M_dataplus._M_p,local_d8.field_2._M_allocated_capacity + 1);
        }
        uVar16 = local_f8.field_2._M_allocated_capacity;
        _Var17._M_p = local_f8._M_dataplus._M_p;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_f8._M_dataplus._M_p == &local_f8.field_2) goto switchD_001078c8_default;
        goto LAB_0010804a;
      case MAX:
        std::operator+(&local_98,"max(",
                       local_78.
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start +
                       *poVar2[lVar18].args.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_start);
        puVar8 = (undefined8 *)std::__cxx11::string::append((char *)&local_98);
        puVar11 = puVar8 + 2;
        if ((ulong *)*puVar8 == puVar11) {
          local_a8 = *puVar11;
          lStack_a0 = puVar8[3];
          local_b8 = &local_a8;
        }
        else {
          local_a8 = *puVar11;
          local_b8 = (ulong *)*puVar8;
        }
        local_b0 = puVar8[1];
        *puVar8 = puVar11;
        puVar8[1] = 0;
        *(undefined1 *)(puVar8 + 2) = 0;
        puVar8 = (undefined8 *)
                 std::__cxx11::string::_M_append
                           ((char *)&local_b8,
                            (ulong)local_78.
                                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                   ._M_impl.super__Vector_impl_data._M_start
                                   [*(int *)(*(long *)&poVar2[lVar18].args.
                                                       super__Vector_base<int,_std::allocator<int>_>
                                                       ._M_impl.super__Vector_impl_data + 4)].
                                   _M_dataplus._M_p);
        local_f8._M_dataplus._M_p = (pointer)&local_f8.field_2;
        puVar11 = puVar8 + 2;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*puVar8 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)puVar11) {
          local_f8.field_2._M_allocated_capacity = *puVar11;
          local_f8.field_2._8_8_ = puVar8[3];
        }
        else {
          local_f8.field_2._M_allocated_capacity = *puVar11;
          local_f8._M_dataplus._M_p = (pointer)*puVar8;
        }
        local_f8._M_string_length = puVar8[1];
        *puVar8 = puVar11;
        puVar8[1] = 0;
        *(undefined1 *)(puVar8 + 2) = 0;
        plVar9 = (long *)std::__cxx11::string::append((char *)&local_f8);
        psVar12 = (size_type *)(plVar9 + 2);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*plVar9 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)psVar12) {
          local_d8.field_2._M_allocated_capacity = *psVar12;
          local_d8.field_2._8_8_ = plVar9[3];
          local_d8._M_dataplus._M_p = (pointer)paVar15;
        }
        else {
          local_d8.field_2._M_allocated_capacity = *psVar12;
          local_d8._M_dataplus._M_p = (pointer)*plVar9;
        }
        local_d8._M_string_length = plVar9[1];
        *plVar9 = (long)psVar12;
        plVar9[1] = 0;
        *(undefined1 *)(plVar9 + 2) = 0;
        std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
        emplace_back<std::__cxx11::string>
                  ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&local_78,
                   &local_d8);
        break;
      case MIN:
        std::operator+(&local_98,"min(",
                       local_78.
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start +
                       *poVar2[lVar18].args.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_start);
        puVar8 = (undefined8 *)std::__cxx11::string::append((char *)&local_98);
        puVar11 = puVar8 + 2;
        if ((ulong *)*puVar8 == puVar11) {
          local_a8 = *puVar11;
          lStack_a0 = puVar8[3];
          local_b8 = &local_a8;
        }
        else {
          local_a8 = *puVar11;
          local_b8 = (ulong *)*puVar8;
        }
        local_b0 = puVar8[1];
        *puVar8 = puVar11;
        puVar8[1] = 0;
        *(undefined1 *)(puVar8 + 2) = 0;
        puVar8 = (undefined8 *)
                 std::__cxx11::string::_M_append
                           ((char *)&local_b8,
                            (ulong)local_78.
                                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                   ._M_impl.super__Vector_impl_data._M_start
                                   [*(int *)(*(long *)&poVar2[lVar18].args.
                                                       super__Vector_base<int,_std::allocator<int>_>
                                                       ._M_impl.super__Vector_impl_data + 4)].
                                   _M_dataplus._M_p);
        local_f8._M_dataplus._M_p = (pointer)&local_f8.field_2;
        puVar11 = puVar8 + 2;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*puVar8 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)puVar11) {
          local_f8.field_2._M_allocated_capacity = *puVar11;
          local_f8.field_2._8_8_ = puVar8[3];
        }
        else {
          local_f8.field_2._M_allocated_capacity = *puVar11;
          local_f8._M_dataplus._M_p = (pointer)*puVar8;
        }
        local_f8._M_string_length = puVar8[1];
        *puVar8 = puVar11;
        puVar8[1] = 0;
        *(undefined1 *)(puVar8 + 2) = 0;
        plVar9 = (long *)std::__cxx11::string::append((char *)&local_f8);
        psVar12 = (size_type *)(plVar9 + 2);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*plVar9 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)psVar12) {
          local_d8.field_2._M_allocated_capacity = *psVar12;
          local_d8.field_2._8_8_ = plVar9[3];
          local_d8._M_dataplus._M_p = (pointer)paVar15;
        }
        else {
          local_d8.field_2._M_allocated_capacity = *psVar12;
          local_d8._M_dataplus._M_p = (pointer)*plVar9;
        }
        local_d8._M_string_length = plVar9[1];
        *plVar9 = (long)psVar12;
        plVar9[1] = 0;
        *(undefined1 *)(plVar9 + 2) = 0;
        std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
        emplace_back<std::__cxx11::string>
                  ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&local_78,
                   &local_d8);
        break;
      default:
        goto switchD_001078c8_default;
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_d8._M_dataplus._M_p != paVar15) {
        operator_delete(local_d8._M_dataplus._M_p,local_d8.field_2._M_allocated_capacity + 1);
      }
      uVar16 = local_f8.field_2._M_allocated_capacity;
      _Var17._M_p = local_f8._M_dataplus._M_p;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_f8._M_dataplus._M_p != &local_f8.field_2) {
LAB_00108017:
        operator_delete(_Var17._M_p,uVar16 + 1);
      }
LAB_0010801f:
      if (local_b8 != &local_a8) {
        operator_delete(local_b8,local_a8 + 1);
      }
      uVar16 = local_98.field_2._M_allocated_capacity;
      _Var17._M_p = local_98._M_dataplus._M_p;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_98._M_dataplus._M_p != &local_98.field_2) {
LAB_0010804a:
        operator_delete(_Var17._M_p,uVar16 + 1);
      }
switchD_001078c8_default:
      iVar6 = local_40->mResultLocation;
      bVar3 = iVar21 < iVar6;
      this = local_40;
      iVar21 = iVar21 + 1;
    } while (bVar3);
  }
  psVar4 = local_38;
  (local_38->_M_dataplus)._M_p = (pointer)&local_38->field_2;
  pcVar1 = local_78.
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start[iVar6]._M_dataplus._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_38,pcVar1,
             pcVar1 + local_78.
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start[iVar6]._M_string_length);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_78);
  return psVar4;
}

Assistant:

std::string Polynomial::evaluateSymbolic(const std::vector<std::string>& varnames) {
  // ASSUME: pt is a pointer to an array 0..numvars-1 of values in the range 0..numConstants-1
  // evaluate at a point
  // 1. fill in the n variables values in the array 'mEvaluationValues'.
  std::vector<std::string> strs; // one for each element in mEvaluationValues, up to the result
  for (int i=0; i < mNumStates; ++i)
    strs.push_back(std::to_string(i));
  for (int i=0; i<mNumVariables; i++)
    strs.push_back(varnames[i]); // previously: "x" + std::to_string(i));
  for (int i = mFirstOperation; i <= mResultLocation; i++)
    {
      operand& a = mOperands[i-mFirstOperation];
      switch (a.op) {
      case operandType::PLUS:
        strs.push_back("(" + strs[a.args[0]] + "+" + strs[a.args[1]] + ")");
        break;
      case operandType::TIMES:
        strs.push_back("(" + strs[a.args[0]] + "*" + strs[a.args[1]] + ")");
        break;
      case operandType::POWER:
        strs.push_back("(" + strs[a.args[0]] + "^" + std::to_string(a.args[1]) + ")");
        break;
      case operandType::MAX:
        strs.push_back("max(" + strs[a.args[0]] + "," + strs[a.args[1]] + ")");
        break;
      case operandType::MIN:
        strs.push_back("min(" + strs[a.args[0]] + "," + strs[a.args[1]] + ")");
        break;
      case operandType::NOT:
        strs.push_back("(~" + strs[a.args[0]] + ")");
        break;
      }
    }
  return strs[mResultLocation];
}